

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Point2f __thiscall
pbrt::PiecewiseConstant2D::Sample(PiecewiseConstant2D *this,Point2f *u,Float *pdf)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  float *in_RDX;
  Tuple2<pbrt::Point2,_float> *in_RSI;
  Float *in_RDI;
  PiecewiseConstant1D *unaff_retaddr;
  Float d0;
  Float d1;
  int y;
  Float pdfs [2];
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  Point2<float> *this_00;
  int local_2c;
  float local_28;
  float local_24;
  Float *pdf_00;
  float local_8;
  float in_stack_fffffffffffffffc;
  
  this_00 = (Point2<float> *)(in_RDI + 0xc);
  pdf_00 = in_RDI;
  Tuple2<pbrt::Point2,_float>::operator[](in_RSI,1);
  PiecewiseConstant1D::Sample(unaff_retaddr,in_stack_fffffffffffffffc,pdf_00,(int *)in_RSI);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  operator[]((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
              *)(in_RDI + 4),(long)local_2c);
  Tuple2<pbrt::Point2,_float>::operator[](in_RSI,0);
  PiecewiseConstant1D::Sample(unaff_retaddr,in_stack_fffffffffffffffc,pdf_00,(int *)in_RSI);
  if (in_RDX != (float *)0x0) {
    *in_RDX = local_28 * local_24;
  }
  Point2<float>::Point2(this_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  TVar1.y = in_stack_fffffffffffffffc;
  TVar1.x = local_8;
  return (Point2f)TVar1;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sample(const Point2f &u, Float *pdf = nullptr) const {
        Float pdfs[2];
        int y;
        Float d1 = pMarginal.Sample(u[1], &pdfs[1], &y);
        Float d0 = pConditionalY[y].Sample(u[0], &pdfs[0]);
        if (pdf != nullptr)
            *pdf = pdfs[0] * pdfs[1];
        return Point2f(d0, d1);
    }